

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTools_inl.hpp
# Opt level: O0

ostream * CLI::detail::streamOutAsParagraph
                    (ostream *out,string *text,size_t paragraphWidth,string *linePrefix,
                    bool skipPrefixOnFirstLine)

{
  bool bVar1;
  byte bVar2;
  istream *piVar3;
  long lVar4;
  ostream *poVar5;
  long local_398;
  size_t charsWritten;
  string local_388 [8];
  string word;
  istringstream iss;
  allocator local_1d1;
  string local_1d0 [8];
  string line;
  istringstream lss;
  bool skipPrefixOnFirstLine_local;
  string *linePrefix_local;
  size_t paragraphWidth_local;
  string *text_local;
  ostream *out_local;
  
  if (!skipPrefixOnFirstLine) {
    ::std::operator<<((ostream *)out,(string *)linePrefix);
  }
  ::std::__cxx11::istringstream::istringstream((istringstream *)((long)&line.field_2 + 8),text,8);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_1d0,"",&local_1d1);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  while( true ) {
    piVar3 = ::std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)(line.field_2._M_local_buf + 8),local_1d0);
    bVar1 = ::std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    if (!bVar1) break;
    ::std::__cxx11::istringstream::istringstream
              ((istringstream *)((long)&word.field_2 + 8),local_1d0,8);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_388,"",(allocator *)((long)&charsWritten + 7));
    ::std::allocator<char>::~allocator((allocator<char> *)((long)&charsWritten + 7));
    local_398 = 0;
    while( true ) {
      piVar3 = ::std::operator>>((istream *)(word.field_2._M_local_buf + 8),local_388);
      bVar1 = ::std::ios::operator_cast_to_bool
                        ((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
      if (!bVar1) break;
      lVar4 = ::std::__cxx11::string::length();
      if (paragraphWidth < (ulong)(lVar4 + local_398)) {
        poVar5 = ::std::operator<<((ostream *)out,'\n');
        ::std::operator<<(poVar5,(string *)linePrefix);
        local_398 = 0;
      }
      poVar5 = ::std::operator<<((ostream *)out,local_388);
      ::std::operator<<(poVar5," ");
      lVar4 = ::std::__cxx11::string::length();
      local_398 = lVar4 + 1 + local_398;
    }
    bVar2 = ::std::ios::eof();
    if ((bVar2 & 1) == 0) {
      poVar5 = ::std::operator<<((ostream *)out,'\n');
      ::std::operator<<(poVar5,(string *)linePrefix);
    }
    ::std::__cxx11::string::~string(local_388);
    ::std::__cxx11::istringstream::~istringstream((istringstream *)(word.field_2._M_local_buf + 8));
  }
  ::std::__cxx11::string::~string(local_1d0);
  ::std::__cxx11::istringstream::~istringstream((istringstream *)(line.field_2._M_local_buf + 8));
  return out;
}

Assistant:

CLI11_INLINE std::ostream &streamOutAsParagraph(std::ostream &out,
                                                const std::string &text,
                                                std::size_t paragraphWidth,
                                                const std::string &linePrefix,
                                                bool skipPrefixOnFirstLine) {
    if(!skipPrefixOnFirstLine)
        out << linePrefix;  // First line prefix

    std::istringstream lss(text);
    std::string line = "";
    while(std::getline(lss, line)) {
        std::istringstream iss(line);
        std::string word = "";
        std::size_t charsWritten = 0;

        while(iss >> word) {
            if(word.length() + charsWritten > paragraphWidth) {
                out << '\n' << linePrefix;
                charsWritten = 0;
            }

            out << word << " ";
            charsWritten += word.length() + 1;
        }

        if(!lss.eof())
            out << '\n' << linePrefix;
    }
    return out;
}